

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

string * dg::vr::strip(string *str,size_t skipSpaces)

{
  long lVar1;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t nextIndex;
  size_t i;
  size_t lastIndex;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (in_RDX <= local_28) {
      std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
      return in_RDI;
    }
    lVar1 = std::__cxx11::string::find((char)in_RSI,0x20);
    if (lVar1 == -1) break;
    local_28 = local_28 + 1;
  }
  std::__cxx11::string::string(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string strip(std::string str, size_t skipSpaces) {
    assert(!str.empty() && !std::isspace(str[0]));

    size_t lastIndex = 0;
    for (size_t i = 0; i < skipSpaces; ++i) {
        size_t nextIndex = str.find(' ', lastIndex + 1);
        if (nextIndex == std::string::npos)
            return str;
        lastIndex = nextIndex;
    }
    return str.substr(0, lastIndex);
}